

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_13::NameResolver::ResolveVar
          (NameResolver *this,BindingHash *bindings,Var *var,char *desc)

{
  bool bVar1;
  Index index_00;
  string *this_00;
  undefined8 uVar2;
  Index index;
  char *desc_local;
  Var *var_local;
  BindingHash *bindings_local;
  NameResolver *this_local;
  
  bVar1 = Var::is_name(var);
  if (bVar1) {
    index_00 = BindingHash::FindIndex(bindings,var);
    if (index_00 == 0xffffffff) {
      this_00 = Var::name_abi_cxx11_(var);
      uVar2 = std::__cxx11::string::c_str((string *)this_00);
      PrintError(this,&var->loc,"undefined %s variable \"%s\"",desc,uVar2);
    }
    else {
      Var::set_index(var,index_00);
    }
  }
  return;
}

Assistant:

void NameResolver::ResolveVar(const BindingHash* bindings,
                              Var* var,
                              const char* desc) {
  if (var->is_name()) {
    Index index = bindings->FindIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined %s variable \"%s\"", desc,
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}